

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O1

vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *
baryonyx::itm::make_unsorted_merged_constraints
          (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *__return_storage_ptr__,context *ctx,problem *pb)

{
  pointer pmVar1;
  pointer pmVar2;
  __normal_iterator<baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  __i;
  pointer pmVar3;
  unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
  cache;
  _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  reserve(__return_storage_ptr__,
          ((long)(pb->greater_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pb->greater_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
          ((long)(pb->less_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pb->less_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
          ((long)(pb->equal_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pb->equal_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
            (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                  *)&local_58,equal,pb,__return_storage_ptr__);
  fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
            (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                  *)&local_58,less,pb,__return_storage_ptr__);
  fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
            (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                  *)&local_58,greater,pb,__return_storage_ptr__);
  pmVar1 = (__return_storage_ptr__->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (__return_storage_ptr__->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar1 != pmVar2) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_unsorted_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
              (pmVar1,pmVar2,
               (int)LZCOUNT(((long)pmVar2 - (long)pmVar1 >> 3) * -0x3333333333333333) * 2 ^ 0x7e);
    if ((long)pmVar2 - (long)pmVar1 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_unsorted_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                (pmVar1,pmVar2);
    }
    else {
      pmVar3 = pmVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_unsorted_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                (pmVar1,pmVar3);
      for (; pmVar3 != pmVar2; pmVar3 = pmVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Val_comp_iter<baryonyx::itm::make_unsorted_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                  (pmVar3);
      }
    }
  }
  std::
  _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<merged_constraint>
make_unsorted_merged_constraints(const baryonyx::context& ctx,
                                 const baryonyx::problem& pb)
{
    std::unordered_map<std::vector<baryonyx::function_element>,
                       std::size_t,
                       merged_constraint_hash>
      cache;

    std::vector<merged_constraint> ret;
    ret.reserve(pb.equal_constraints.size() + pb.less_constraints.size() +
                pb.greater_constraints.size());

    fill_merged_constraints(
      ctx, cache, baryonyx::operator_type::equal, pb, ret);
    fill_merged_constraints(
      ctx, cache, baryonyx::operator_type::less, pb, ret);
    fill_merged_constraints(
      ctx, cache, baryonyx::operator_type::greater, pb, ret);

    std::sort(ret.begin(), ret.end(), [](const auto& lhs, const auto& rhs) {
        return lhs.id < rhs.id;
    });

    return ret;
}